

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall Lexer::advance(Lexer *this)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  Lexer *this_local;
  
  this->index_ = this->index_ + 1;
  iVar1 = this->index_;
  uVar2 = std::__cxx11::string::length();
  if ((ulong)(long)iVar1 < uVar2) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&this->input_);
    this->current_ = *pcVar3;
  }
  else {
    this->current_ = this->npos;
  }
  maintain_position(this);
  return;
}

Assistant:

void Lexer::advance() {
    index_++;
    if (index_ >= input_.length()) {
        current_ = npos;
    } else {
        current_ = input_[index_];
    }
    maintain_position();
}